

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O0

void ipred_bi_uv(pel *src,pel *dst,int i_dst,int w,int h,int bit_depth)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  byte bVar11;
  int aiStack_e94 [236];
  pel local_ae4;
  int local_ae0;
  int local_adc;
  pel local_ad8;
  int local_ad4;
  int local_ad0;
  int local_acc;
  int local_ac8;
  byte local_ac4;
  int local_ac0;
  int local_abc;
  int wxy_v;
  int wxy_u;
  int predx_v;
  int predx_u;
  int y2;
  int val_v;
  int val_u;
  int max_pel;
  int h2;
  int w2;
  int tbl_wc [6];
  int iStack_a78;
  int wc;
  int wy [128];
  int le [128];
  int up [128];
  int ref_le [128];
  int ref_up [128];
  int local_6c;
  int tmp_v;
  int wt_v;
  int c_v;
  int b_v;
  int a_v;
  int tmp_u;
  int wt_u;
  int c_u;
  int b_u;
  int a_u;
  int offset;
  int ishift_xy;
  int ishift;
  int ishift_y;
  int ishift_x;
  int y;
  int x;
  int bit_depth_local;
  int h_local;
  int w_local;
  int i_dst_local;
  pel *dst_local;
  pel *src_local;
  
  bVar1 = g_tbl_log2[w];
  local_ac8 = (int)(char)bVar1;
  bVar2 = g_tbl_log2[h];
  iVar3 = (int)(char)bVar2;
  local_ac4 = bVar2;
  if (local_ac8 < iVar3) {
    local_ac4 = bVar1;
  }
  bVar11 = bVar1 + bVar2 + 1;
  iVar4 = 1 << (bVar1 + bVar2 & 0x1f);
  _h2 = 0x15ffffffff;
  tbl_wc[0] = 0xd;
  tbl_wc[1] = 7;
  tbl_wc[2] = 4;
  tbl_wc[3] = 2;
  iVar5 = w * 2;
  iVar6 = (1 << ((byte)bit_depth & 0x1f)) + -1;
  if (iVar3 < local_ac8) {
    local_ac8 = local_ac8 - iVar3;
  }
  else {
    local_ac8 = iVar3 - local_ac8;
  }
  tbl_wc[5] = local_ac8;
  tbl_wc[5] = (&h2)[local_ac8];
  for (ishift_x = 0; ishift_x < iVar5; ishift_x = ishift_x + 1) {
    ref_le[(long)ishift_x + 0x7e] = (uint)src[ishift_x + 2];
  }
  for (ishift_y = 0; ishift_y < h * 2; ishift_y = ishift_y + 2) {
    up[(long)ishift_y + 0x7e] = (uint)src[-2 - ishift_y];
    up[(long)(ishift_y + 1) + 0x7e] = (uint)src[-1 - ishift_y];
  }
  uVar7 = (uint)src[iVar5];
  uVar8 = (uint)src[h * -2];
  if (w == h) {
    local_acc = (int)(uVar7 + uVar8 + 1) >> 1;
  }
  else {
    local_acc = (int)(((uVar7 << (bVar1 & 0x1f)) + (uVar8 << (bVar2 & 0x1f))) * tbl_wc[5] +
                     (1 << (local_ac4 + 5 & 0x1f))) >> (local_ac4 + 6 & 0x1f);
  }
  uVar9 = (uint)src[iVar5 + 1];
  uVar10 = (uint)src[h * -2 + 1];
  if (w == h) {
    local_ad0 = (int)(uVar9 + uVar10 + 1) >> 1;
  }
  else {
    local_ad0 = (int)(((uVar9 << (bVar1 & 0x1f)) + (uVar10 << (bVar2 & 0x1f))) * tbl_wc[5] +
                     (1 << (local_ac4 + 5 & 0x1f))) >> (local_ac4 + 6 & 0x1f);
  }
  for (ishift_x = 0; ishift_x < iVar5; ishift_x = ishift_x + 2) {
    le[(long)ishift_x + 0x7e] = uVar8 - ref_le[(long)ishift_x + 0x7e];
    le[(long)(ishift_x + 1) + 0x7e] = uVar10 - ref_le[(long)(ishift_x + 1) + 0x7e];
    ref_le[(long)ishift_x + 0x7e] = ref_le[(long)ishift_x + 0x7e] << (bVar2 & 0x1f);
    ref_le[(long)(ishift_x + 1) + 0x7e] = ref_le[(long)(ishift_x + 1) + 0x7e] << (bVar2 & 0x1f);
  }
  local_6c = 0;
  b_v = 0;
  for (ishift_y = 0; ishift_y < h * 2; ishift_y = ishift_y + 2) {
    wy[(long)ishift_y + 0x7e] = uVar7 - up[(long)ishift_y + 0x7e];
    wy[(long)(ishift_y + 1) + 0x7e] = uVar9 - up[(long)(ishift_y + 1) + 0x7e];
    up[(long)ishift_y + 0x7e] = up[(long)ishift_y + 0x7e] << (bVar1 & 0x1f);
    up[(long)(ishift_y + 1) + 0x7e] = up[(long)(ishift_y + 1) + 0x7e] << (bVar1 & 0x1f);
    (&iStack_a78)[ishift_y] = b_v;
    (&iStack_a78)[ishift_y + 1] = local_6c;
    b_v = ((local_acc * 2 - uVar7) - uVar8) + b_v;
    local_6c = ((local_ad0 * 2 - uVar9) - uVar10) + local_6c;
  }
  _w_local = dst;
  for (ishift_y = 0; ishift_y < h; ishift_y = ishift_y + 1) {
    iVar3 = ishift_y * 2;
    wxy_u = up[(long)iVar3 + 0x7e];
    wxy_v = up[(long)(iVar3 + 1) + 0x7e];
    local_abc = 0;
    local_ac0 = 0;
    for (ishift_x = 0; ishift_x < iVar5; ishift_x = ishift_x + 2) {
      wxy_u = wy[(long)iVar3 + 0x7e] + wxy_u;
      wxy_v = wy[(long)(iVar3 + 1) + 0x7e] + wxy_v;
      ref_le[(long)ishift_x + 0x7e] = le[(long)ishift_x + 0x7e] + ref_le[(long)ishift_x + 0x7e];
      ref_le[(long)(ishift_x + 1) + 0x7e] =
           le[(long)(ishift_x + 1) + 0x7e] + ref_le[(long)(ishift_x + 1) + 0x7e];
      local_adc = (wxy_u << (bVar2 & 0x1f)) + (ref_le[(long)ishift_x + 0x7e] << (bVar1 & 0x1f)) +
                  local_abc + iVar4 >> (bVar11 & 0x1f);
      aiStack_e94[0xeb] =
           (wxy_v << (bVar2 & 0x1f)) + (ref_le[(long)(ishift_x + 1) + 0x7e] << (bVar1 & 0x1f)) +
           local_ac0 + iVar4 >> (bVar11 & 0x1f);
      local_ad4 = local_adc;
      if (iVar6 < local_adc) {
        local_ad4 = iVar6;
      }
      if (local_ad4 < 0) {
        local_ad8 = '\0';
      }
      else {
        if (iVar6 < local_adc) {
          local_adc = iVar6;
        }
        local_ad8 = (pel)local_adc;
      }
      _w_local[ishift_x] = local_ad8;
      local_ae0 = aiStack_e94[0xeb];
      if (iVar6 < aiStack_e94[0xeb]) {
        local_ae0 = iVar6;
      }
      if (local_ae0 < 0) {
        local_ae4 = '\0';
      }
      else {
        if (iVar6 < aiStack_e94[0xeb]) {
          aiStack_e94[0xeb] = iVar6;
        }
        local_ae4 = (pel)aiStack_e94[0xeb];
      }
      _w_local[ishift_x + 1] = local_ae4;
      local_abc = (&iStack_a78)[iVar3] + local_abc;
      local_ac0 = (&iStack_a78)[iVar3 + 1] + local_ac0;
    }
    _w_local = _w_local + i_dst;
  }
  return;
}

Assistant:

void ipred_bi_uv(pel *src, pel *dst, int i_dst, int w, int h, int bit_depth)
{
    uavs3d_assert(g_tbl_log2[w] >= 2);
    uavs3d_assert(g_tbl_log2[h] >= 2);

    int x, y;
    int ishift_x = g_tbl_log2[w];
    int ishift_y = g_tbl_log2[h];
    int ishift = COM_MIN(ishift_x, ishift_y);
    int ishift_xy = ishift_x + ishift_y + 1;
    int offset = 1 << (ishift_x + ishift_y);
    int a_u, b_u, c_u, wt_u, tmp_u;
    int a_v, b_v, c_v, wt_v, tmp_v;
    int ref_up[MAX_CU_SIZE], ref_le[MAX_CU_SIZE], up[MAX_CU_SIZE], le[MAX_CU_SIZE], wy[MAX_CU_SIZE];
    int wc, tbl_wc[6] = { -1, 21, 13, 7, 4, 2 };
    int w2 = w << 1;
    int h2 = h << 1;
    int max_pel = (1 << bit_depth) - 1;
    int val_u, val_v;

    wc = ishift_x > ishift_y ? ishift_x - ishift_y : ishift_y - ishift_x;
    uavs3d_assert(wc <= 5);

    wc = tbl_wc[wc];
    for (x = 0; x < w2; x++) {
        ref_up[x] = src[x + 2];  
    }
    for (y = 0; y < h2; y += 2) {
        ref_le[y    ] = src[-y - 2];
        ref_le[y + 1] = src[-y - 1];
    }

    a_u = src[w2];
    b_u = src[-h2];
    c_u = (w == h) ? (a_u + b_u + 1) >> 1 : (((a_u << ishift_x) + (b_u << ishift_y)) * wc + (1 << (ishift + 5))) >> (ishift + 6);
    wt_u = (c_u << 1) - a_u - b_u;

    a_v = src[w2 + 1];
    b_v = src[-h2 + 1];
    c_v = (w == h) ? (a_v + b_v + 1) >> 1 : (((a_v << ishift_x) + (b_v << ishift_y)) * wc + (1 << (ishift + 5))) >> (ishift + 6);
    wt_v = (c_v << 1) - a_v - b_v;

    for (x = 0; x < w2; x += 2) {
        up[x    ] = b_u - ref_up[x];
        up[x + 1] = b_v - ref_up[x + 1];
        ref_up[x    ] <<= ishift_y;
        ref_up[x + 1] <<= ishift_y;
    }
    tmp_u = tmp_v = 0;
    for (y = 0; y < h2; y += 2) {
        le[y    ] = a_u - ref_le[y];
        le[y + 1] = a_v - ref_le[y + 1];
        ref_le[y    ] <<= ishift_x;
        ref_le[y + 1] <<= ishift_x;
        wy[y    ] = tmp_u;
        wy[y + 1] = tmp_v;
        tmp_u += wt_u;
        tmp_v += wt_v;
    }
    for (y = 0; y < h; y++) {
        int y2 = y << 1;
        int predx_u = ref_le[y2    ];
        int predx_v = ref_le[y2 + 1];
        int wxy_u = 0;
        int wxy_v = 0;
        for (x = 0; x < w2; x += 2) {
            predx_u += le[y2];
            predx_v += le[y2 + 1];
            ref_up[x    ] += up[x];
            ref_up[x + 1] += up[x + 1];
            val_u = ((predx_u << ishift_y) + (ref_up[x    ] << ishift_x) + wxy_u + offset) >> ishift_xy;
            val_v = ((predx_v << ishift_y) + (ref_up[x + 1] << ishift_x) + wxy_v + offset) >> ishift_xy;
            dst[x    ] = COM_CLIP3(0, max_pel, val_u);
            dst[x + 1] = COM_CLIP3(0, max_pel, val_v);
            wxy_u += wy[y2];
            wxy_v += wy[y2 + 1];
        }
        dst += i_dst;
    }
}